

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void __thiscall ImGuiListClipper::End(ImGuiListClipper *this)

{
  int iVar1;
  ImGuiListClipperData *pIVar2;
  int *in_RDI;
  ImGuiListClipperData *data;
  ImGuiContext *g;
  long lVar3;
  ImGuiContext *clipper;
  
  lVar3 = *(long *)(in_RDI + 6);
  if (lVar3 != 0) {
    clipper = GImGui;
    if ((GImGui->DebugLogFlags & 0x10U) != 0) {
      ImGui::DebugLog("Clipper: End() in \'%s\'\n",GImGui->CurrentWindow->Name);
    }
    if (((-1 < in_RDI[2]) && (in_RDI[2] < 0x7fffffff)) && (-1 < *in_RDI)) {
      ImGuiListClipper_SeekCursorForItem((ImGuiListClipper *)clipper,(int)((ulong)lVar3 >> 0x20));
    }
    *(undefined4 *)(lVar3 + 0xc) = *(undefined4 *)(lVar3 + 0x18);
    iVar1 = clipper->ClipperTempDataStacked + -1;
    clipper->ClipperTempDataStacked = iVar1;
    if (0 < iVar1) {
      pIVar2 = ImVector<ImGuiListClipperData>::operator[]
                         (&clipper->ClipperTempData,clipper->ClipperTempDataStacked + -1);
      pIVar2->ListClipper->TempData = pIVar2;
    }
    in_RDI[6] = 0;
    in_RDI[7] = 0;
  }
  in_RDI[2] = -1;
  return;
}

Assistant:

void ImGuiListClipper::End()
{
    ImGuiContext& g = *GImGui;
    if (ImGuiListClipperData* data = (ImGuiListClipperData*)TempData)
    {
        // In theory here we should assert that we are already at the right position, but it seems saner to just seek at the end and not assert/crash the user.
        IMGUI_DEBUG_LOG_CLIPPER("Clipper: End() in '%s'\n", g.CurrentWindow->Name);
        if (ItemsCount >= 0 && ItemsCount < INT_MAX && DisplayStart >= 0)
            ImGuiListClipper_SeekCursorForItem(this, ItemsCount);

        // Restore temporary buffer and fix back pointers which may be invalidated when nesting
        IM_ASSERT(data->ListClipper == this);
        data->StepNo = data->Ranges.Size;
        if (--g.ClipperTempDataStacked > 0)
        {
            data = &g.ClipperTempData[g.ClipperTempDataStacked - 1];
            data->ListClipper->TempData = data;
        }
        TempData = NULL;
    }
    ItemsCount = -1;
}